

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjAddFanins(Acb_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  undefined4 local_24;
  int iFanin;
  int i;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  if (vFanins != (Vec_Int_t *)0x0) {
    for (local_24 = 0; iVar1 = Vec_IntSize(vFanins), local_24 < iVar1; local_24 = local_24 + 1) {
      iVar1 = Vec_IntEntry(vFanins,local_24);
      Acb_ObjAddFanin(p,iObj,iVar1);
    }
  }
  return;
}

Assistant:

static inline void Acb_ObjAddFanins( Acb_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    if ( vFanins )
        Vec_IntForEachEntry( vFanins, iFanin, i )
            Acb_ObjAddFanin( p, iObj, iFanin );
}